

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGLayoutState::SVGLayoutState
          (SVGLayoutState *this,SVGLayoutState *parent,SVGElement *element)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view input_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  string_view input_01;
  string_view input_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  string_view input_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  string_view input_04;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  FillRule FVar1;
  long lVar2;
  bool bVar3;
  LengthUnits LVar4;
  FillRule FVar5;
  LineCap LVar6;
  WhiteSpace WVar7;
  FontWeight FVar8;
  Visibility VVar9;
  DominantBaseline DVar10;
  AlignmentBaseline AVar11;
  Direction DVar12;
  Overflow OVar13;
  FontStyle FVar14;
  Display DVar15;
  TextAnchor TVar16;
  MaskType MVar17;
  LineJoin LVar18;
  int iVar19;
  Color CVar20;
  Length LVar21;
  undefined1 allowPercentage;
  Type TVar22;
  _Fwd_list_impl _Var24;
  string *this_00;
  Paint *this_01;
  Color *in_R8;
  Color *in_R9;
  size_type sVar25;
  size_type __n;
  long lVar26;
  float fVar27;
  string_view input_05;
  string_view input_06;
  string_view input_07;
  string_view input_08;
  string_view input_09;
  string_view input_10;
  string_view input_11;
  string_view input_12;
  string_view input_13;
  basic_string_view<char,_std::char_traits<char>_> bVar28;
  string_view input;
  LengthList values;
  Length local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  LengthList *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  Paint *local_58;
  Paint *local_50;
  _Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_> local_48;
  size_t sVar23;
  
  this->m_parent = parent;
  this->m_element = element;
  local_50 = &this->m_fill;
  Paint::Paint(local_50,&parent->m_fill);
  local_58 = &this->m_stroke;
  Paint::Paint(local_58,&parent->m_stroke);
  (this->m_color).m_value = (parent->m_color).m_value;
  (this->m_stop_color).m_value = 0xff000000;
  this->m_opacity = 1.0;
  fVar27 = parent->m_stroke_opacity;
  this->m_fill_opacity = parent->m_fill_opacity;
  this->m_stroke_opacity = fVar27;
  this->m_stop_opacity = 1.0;
  fVar27 = parent->m_font_size;
  this->m_stroke_miterlimit = parent->m_stroke_miterlimit;
  this->m_font_size = fVar27;
  (this->m_baseline_shit).m_type = Baseline;
  (this->m_baseline_shit).m_length.m_value = 0.0;
  (this->m_baseline_shit).m_length.m_units = None;
  this->m_stroke_width = parent->m_stroke_width;
  this->m_stroke_dashoffset = parent->m_stroke_dashoffset;
  local_90 = &this->m_stroke_dasharray;
  std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
            (local_90,&parent->m_stroke_dasharray);
  LVar18 = parent->m_stroke_linejoin;
  FVar5 = parent->m_fill_rule;
  FVar1 = parent->m_clip_rule;
  this->m_stroke_linecap = parent->m_stroke_linecap;
  this->m_stroke_linejoin = LVar18;
  this->m_fill_rule = FVar5;
  this->m_clip_rule = FVar1;
  this->m_font_weight = parent->m_font_weight;
  this->m_font_style = parent->m_font_style;
  this->m_alignment_baseline = Auto;
  TVar16 = parent->m_text_anchor;
  WVar7 = parent->m_white_space;
  DVar12 = parent->m_direction;
  this->m_dominant_baseline = parent->m_dominant_baseline;
  this->m_text_anchor = TVar16;
  this->m_white_space = WVar7;
  this->m_direction = DVar12;
  this->m_display = Inline;
  this->m_visibility = parent->m_visibility;
  this->m_overflow = (element->super_SVGNode).m_parentElement != (SVGElement *)0x0;
  this->m_mask_type = Luminance;
  (this->m_mask)._M_dataplus._M_p = (pointer)&(this->m_mask).field_2;
  (this->m_mask)._M_string_length = 0;
  local_60 = (string *)&this->m_mask;
  (this->m_mask).field_2._M_local_buf[0] = '\0';
  local_68 = (string *)&this->m_clip_path;
  (this->m_clip_path)._M_dataplus._M_p = (pointer)&(this->m_clip_path).field_2;
  (this->m_clip_path)._M_string_length = 0;
  (this->m_clip_path).field_2._M_local_buf[0] = '\0';
  local_70 = (string *)&this->m_marker_start;
  std::__cxx11::string::string(local_70,(string *)&parent->m_marker_start);
  local_78 = (string *)&this->m_marker_mid;
  std::__cxx11::string::string(local_78,(string *)&parent->m_marker_mid);
  local_80 = (string *)&this->m_marker_end;
  std::__cxx11::string::string(local_80,(string *)&parent->m_marker_end);
  local_88 = (string *)&this->m_font_family;
  std::__cxx11::string::string(local_88,(string *)&parent->m_font_family);
  _Var24._M_head._M_next = (_Fwd_list_node_base)&element->m_attributes;
switchD_00114515_caseD_3:
  do {
    _Var24._M_head._M_next = *(_Fwd_list_node_base *)_Var24._M_head._M_next;
    if (_Var24._M_head._M_next == (_Fwd_list_node_base)0x0) {
      return;
    }
    input._M_str = *(char **)((long)_Var24._M_head._M_next + 0x10);
    sVar23 = *(size_t *)((long)_Var24._M_head._M_next + 0x18);
    input._M_len = sVar23;
    stripLeadingAndTrailingSpaces(&input);
    allowPercentage = (undefined1)sVar23;
  } while ((input._M_len == 0) ||
          (iVar19 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&input,"inherit")
          , iVar19 == 0));
  switch(*(undefined1 *)((long)_Var24._M_head._M_next + 0xc)) {
  case 1:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x130) {
        AVar11 = Auto;
        goto LAB_00114d25;
      }
      __x._M_str = input._M_str;
      __x._M_len = input._M_len;
      bVar3 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                   (&UNK_00154ba8 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    AVar11 = (&UNK_00154ba0)[lVar26];
LAB_00114d25:
    this->m_alignment_baseline = AVar11;
    goto switchD_00114515_caseD_3;
  case 2:
    iVar19 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&input,"baseline");
    if (iVar19 == 0) {
      TVar22 = Baseline;
LAB_00114e48:
      LVar21.m_value = 0.0;
      LVar21.m_units = None;
      LVar21._5_3_ = 0;
      LVar4 = None;
    }
    else {
      iVar19 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&input,"sub");
      if (iVar19 == 0) {
        TVar22 = Sub;
        goto LAB_00114e48;
      }
      iVar19 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&input,"super");
      if (iVar19 == 0) {
        TVar22 = Super;
        goto LAB_00114e48;
      }
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)values.
                            super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffff0000000000);
      LVar21 = parseLength(&input,Allow,(Length *)&values);
      LVar4 = LVar21.m_units;
      TVar22 = Length;
    }
    (this->m_baseline_shit).m_type = TVar22;
    (this->m_baseline_shit).m_length.m_value = LVar21.m_value;
    (this->m_baseline_shit).m_length.m_units = LVar4;
  default:
    goto switchD_00114515_caseD_3;
  case 5:
    input_01._M_str = input._M_str;
    input_01._M_len = input._M_len;
    parseUrl_abi_cxx11_(input_01);
    this_00 = local_68;
    break;
  case 6:
    FVar5 = parseFillRule(&input);
    this->m_clip_rule = FVar5;
    goto switchD_00114515_caseD_3;
  case 7:
    input_07._M_str = (char *)this;
    input_07._M_len = (size_t)input._M_str;
    CVar20 = parseColor((lunasvg *)input._M_len,input_07,(SVGLayoutState *)&Color::Black,in_R8);
    (this->m_color).m_value = CVar20.m_value;
    goto switchD_00114515_caseD_3;
  case 0xb:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x40) {
        DVar12 = Ltr;
        goto LAB_00114d3a;
      }
      __x_04._M_str = input._M_str;
      __x_04._M_len = input._M_len;
      bVar3 = std::operator==(__x_04,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154de8 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    DVar12 = (&UNK_00154de0)[lVar26];
LAB_00114d3a:
    this->m_direction = DVar12;
    goto switchD_00114515_caseD_3;
  case 0xc:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x40) {
        DVar15 = Inline;
        goto LAB_00114d79;
      }
      __x_07._M_str = input._M_str;
      __x_07._M_len = input._M_len;
      bVar3 = std::operator==(__x_07,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154f18 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    DVar15 = (&UNK_00154f10)[lVar26];
LAB_00114d79:
    this->m_display = DVar15;
    goto switchD_00114515_caseD_3;
  case 0xd:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x130) {
        DVar10 = Auto;
        goto LAB_00114d10;
      }
      __x_03._M_str = input._M_str;
      __x_03._M_len = input._M_len;
      bVar3 = std::operator==(__x_03,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154cc8 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    DVar10 = (&UNK_00154cc0)[lVar26];
LAB_00114d10:
    this->m_dominant_baseline = DVar10;
    goto switchD_00114515_caseD_3;
  case 0x10:
    in_R8 = (Color *)&Color::Black;
    input_06._M_str = (char *)this;
    input_06._M_len = (size_t)input._M_str;
    parsePaint((Paint *)&values,(lunasvg *)input._M_len,input_06,(SVGLayoutState *)&Color::Black,
               in_R9);
    this_01 = local_50;
    goto LAB_00114b2f;
  case 0x11:
    input_08._M_str = (char *)0x1;
    input_08._M_len = (size_t)input._M_str;
    fVar27 = parseNumberOrPercentage((lunasvg *)input._M_len,input_08,(bool)allowPercentage,1.0);
    this->m_fill_opacity = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x12:
    FVar5 = parseFillRule(&input);
    this->m_fill_rule = FVar5;
    goto switchD_00114515_caseD_3;
  case 0x13:
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              (local_88,&input);
    goto switchD_00114515_caseD_3;
  case 0x14:
    values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)input._M_len;
    values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)input._M_str;
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT35(local_48._M_impl.super__Vector_impl_data._M_start._5_3_,0x41400000);
    LVar21 = parseLength((string_view *)&values,Forbid,(Length *)&local_48);
    fVar27 = LVar21.m_value;
    LVar4 = LVar21.m_units;
    if (LVar4 == Ex) {
      fVar27 = fVar27 * this->m_font_size * 0.5;
    }
    else if (LVar4 == Em) {
      fVar27 = fVar27 * this->m_font_size;
    }
    else if (LVar4 == Percent) {
      fVar27 = (fVar27 * this->m_font_size) / 100.0;
    }
    this->m_font_size = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x15:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x58) {
        FVar14 = Normal;
        goto LAB_00114d64;
      }
      __x_06._M_str = input._M_str;
      __x_06._M_len = input._M_len;
      bVar3 = std::operator==(__x_06,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154b58 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    FVar14 = (&UNK_00154b50)[lVar26];
LAB_00114d64:
    this->m_font_style = FVar14;
    goto switchD_00114515_caseD_3;
  case 0x16:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x148) {
        FVar8 = Normal;
        goto LAB_00114ce6;
      }
      __x_01._M_str = input._M_str;
      __x_01._M_len = input._M_len;
      bVar3 = std::operator==(__x_01,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&parseFillRule::entries[1].second._M_str + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    FVar8 = *(FontWeight *)((long)&parseFillRule::entries[1].second._M_len + lVar26);
LAB_00114ce6:
    this->m_font_weight = FVar8;
    goto switchD_00114515_caseD_3;
  case 0x22:
    input_02._M_str = input._M_str;
    input_02._M_len = input._M_len;
    parseUrl_abi_cxx11_(input_02);
    this_00 = local_80;
    break;
  case 0x23:
    input_00._M_str = input._M_str;
    input_00._M_len = input._M_len;
    parseUrl_abi_cxx11_(input_00);
    this_00 = local_78;
    break;
  case 0x24:
    input_03._M_str = input._M_str;
    input_03._M_len = input._M_len;
    parseUrl_abi_cxx11_(input_03);
    this_00 = local_70;
    break;
  case 0x25:
    input_04._M_str = input._M_str;
    input_04._M_len = input._M_len;
    parseUrl_abi_cxx11_(input_04);
    this_00 = local_60;
    break;
  case 0x28:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x40) {
        MVar17 = Luminance;
        goto LAB_00114da3;
      }
      __x_09._M_str = input._M_str;
      __x_09._M_len = input._M_len;
      bVar3 = std::operator==(__x_09,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&PTR_anon_var_dwarf_6a966_00154fc8 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    MVar17 = *(MaskType *)((long)&DAT_00154fc0 + lVar26);
LAB_00114da3:
    this->m_mask_type = MVar17;
    goto switchD_00114515_caseD_3;
  case 0x2a:
    input_09._M_str = (char *)0x1;
    input_09._M_len = (size_t)input._M_str;
    fVar27 = parseNumberOrPercentage((lunasvg *)input._M_len,input_09,(bool)allowPercentage,1.0);
    this->m_opacity = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x2c:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x40) {
        OVar13 = Visible;
        goto LAB_00114d4f;
      }
      __x_05._M_str = input._M_str;
      __x_05._M_len = input._M_len;
      bVar3 = std::operator==(__x_05,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154f98 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    OVar13 = (&UNK_00154f90)[lVar26];
LAB_00114d4f:
    this->m_overflow = OVar13;
    goto switchD_00114515_caseD_3;
  case 0x39:
    input_11._M_str = (char *)this;
    input_11._M_len = (size_t)input._M_str;
    CVar20 = parseColor((lunasvg *)input._M_len,input_11,(SVGLayoutState *)&Color::Black,in_R8);
    (this->m_stop_color).m_value = CVar20.m_value;
    goto switchD_00114515_caseD_3;
  case 0x3a:
    input_12._M_str = (char *)0x1;
    input_12._M_len = (size_t)input._M_str;
    fVar27 = parseNumberOrPercentage((lunasvg *)input._M_len,input_12,(bool)allowPercentage,1.0);
    this->m_stop_opacity = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x3b:
    in_R8 = (Color *)&Color::Transparent;
    input_05._M_str = (char *)this;
    input_05._M_len = (size_t)input._M_str;
    parsePaint((Paint *)&values,(lunasvg *)input._M_len,input_05,
               (SVGLayoutState *)&Color::Transparent,in_R9);
    this_01 = local_58;
LAB_00114b2f:
    Paint::operator=(this_01,(Paint *)&values);
    goto LAB_00114b37;
  case 0x3c:
    local_a0._M_len = input._M_len;
    local_a0._M_str = input._M_str;
    iVar19 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_a0,"none");
    if (iVar19 == 0) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        sVar25 = 0;
        while ((__n = local_a0._M_len, local_a0._M_len != sVar25 &&
               ((0x2c < (ulong)(byte)local_a0._M_str[sVar25] ||
                (__n = sVar25,
                (0x100100002600U >> ((ulong)(byte)local_a0._M_str[sVar25] & 0x3f) & 1) == 0))))) {
          sVar25 = sVar25 + 1;
        }
        local_a8.m_value = 0.0;
        local_a8.m_units = None;
        bVar28 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_a0,0,__n);
        bVar3 = Length::parse(&local_a8,bVar28,Forbid);
        if (!bVar3) {
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          goto LAB_00114df6;
        }
        local_a0._M_str = local_a0._M_str + __n;
        local_a0._M_len = local_a0._M_len - __n;
        std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::
        emplace_back<lunasvg::Length>(&values,&local_a8);
        bVar3 = skipOptionalSpacesOrComma(&local_a0);
      } while (bVar3);
      local_48._M_impl.super__Vector_impl_data._M_start =
           values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48._M_impl.super__Vector_impl_data._M_finish =
           values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
           values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00114df6:
      std::_Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>::~_Vector_base
                (&values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>);
    }
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::_M_move_assign
              (local_90,&local_48);
    std::_Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>::~_Vector_base(&local_48);
    goto switchD_00114515_caseD_3;
  case 0x3d:
    values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)values.
                          super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffff0000000000);
    LVar21 = parseLength(&input,Allow,(Length *)&values);
    (this->m_stroke_dashoffset).m_value = LVar21.m_value;
    (this->m_stroke_dashoffset).m_units = LVar21.m_units;
    goto switchD_00114515_caseD_3;
  case 0x3e:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x58) {
        LVar6 = Butt;
        goto LAB_00114cbc;
      }
      __x_00._M_str = input._M_str;
      __x_00._M_len = input._M_len;
      bVar3 = std::operator==(__x_00,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154948 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    LVar6 = *(LineCap *)((long)&PTR_typeinfo_00154940 + lVar26);
LAB_00114cbc:
    this->m_stroke_linecap = LVar6;
    goto switchD_00114515_caseD_3;
  case 0x3f:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x58) {
        LVar18 = Miter;
        goto LAB_00114db8;
      }
      __x_10._M_str = input._M_str;
      __x_10._M_len = input._M_len;
      bVar3 = std::operator==(__x_10,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154998 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    LVar18 = (&UNK_00154990)[lVar26];
LAB_00114db8:
    this->m_stroke_linejoin = LVar18;
    goto switchD_00114515_caseD_3;
  case 0x40:
    input_13._M_str = (char *)0x0;
    input_13._M_len = (size_t)input._M_str;
    fVar27 = parseNumberOrPercentage((lunasvg *)input._M_len,input_13,(bool)allowPercentage,4.0);
    this->m_stroke_miterlimit = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x41:
    input_10._M_str = (char *)0x1;
    input_10._M_len = (size_t)input._M_str;
    fVar27 = parseNumberOrPercentage((lunasvg *)input._M_len,input_10,(bool)allowPercentage,1.0);
    this->m_stroke_opacity = fVar27;
    goto switchD_00114515_caseD_3;
  case 0x42:
    values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT35(values.
                           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                           _M_impl.super__Vector_impl_data._M_start._5_3_,0x3f800000);
    LVar21 = parseLength(&input,Forbid,(Length *)&values);
    (this->m_stroke_width).m_value = LVar21.m_value;
    (this->m_stroke_width).m_units = LVar21.m_units;
    goto switchD_00114515_caseD_3;
  case 0x45:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x58) {
        TVar16 = Start;
        goto LAB_00114d8e;
      }
      __x_08._M_str = input._M_str;
      __x_08._M_len = input._M_len;
      bVar3 = std::operator==(__x_08,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&PTR_anon_var_dwarf_6a7db_00154e18 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    TVar16 = *(TextAnchor *)((long)&DAT_00154e10 + lVar26);
LAB_00114d8e:
    this->m_text_anchor = TVar16;
    goto switchD_00114515_caseD_3;
  case 0x48:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0x58) {
        VVar9 = Visible;
        goto LAB_00114cfb;
      }
      __x_02._M_str = input._M_str;
      __x_02._M_len = input._M_len;
      bVar3 = std::operator==(__x_02,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&PTR_anon_var_dwarf_62bd9_00154f48 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    VVar9 = *(Visibility *)((long)&DAT_00154f40 + lVar26);
LAB_00114cfb:
    this->m_visibility = VVar9;
    goto switchD_00114515_caseD_3;
  case 0x49:
    lVar2 = 0x10;
    do {
      lVar26 = lVar2;
      if (lVar26 == 0xb8) {
        WVar7 = Default;
        goto LAB_00114cd1;
      }
      bVar28._M_str = input._M_str;
      bVar28._M_len = input._M_len;
      bVar3 = std::operator==(bVar28,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (&UNK_00154e68 + lVar26));
      lVar2 = lVar26 + 0x18;
    } while (!bVar3);
    WVar7 = (&UNK_00154e60)[lVar26];
LAB_00114cd1:
    this->m_white_space = WVar7;
    goto switchD_00114515_caseD_3;
  }
  std::__cxx11::string::operator=(this_00,(string *)&values);
LAB_00114b37:
  std::__cxx11::string::~string((string *)&values);
  goto switchD_00114515_caseD_3;
}

Assistant:

SVGLayoutState::SVGLayoutState(const SVGLayoutState& parent, const SVGElement* element)
    : m_parent(&parent)
    , m_element(element)
    , m_fill(parent.fill())
    , m_stroke(parent.stroke())
    , m_color(parent.color())
    , m_fill_opacity(parent.fill_opacity())
    , m_stroke_opacity(parent.stroke_opacity())
    , m_stroke_miterlimit(parent.stroke_miterlimit())
    , m_font_size(parent.font_size())
    , m_stroke_width(parent.stroke_width())
    , m_stroke_dashoffset(parent.stroke_dashoffset())
    , m_stroke_dasharray(parent.stroke_dasharray())
    , m_stroke_linecap(parent.stroke_linecap())
    , m_stroke_linejoin(parent.stroke_linejoin())
    , m_fill_rule(parent.fill_rule())
    , m_clip_rule(parent.clip_rule())
    , m_font_weight(parent.font_weight())
    , m_font_style(parent.font_style())
    , m_dominant_baseline(parent.dominant_baseline())
    , m_text_anchor(parent.text_anchor())
    , m_white_space(parent.white_space())
    , m_direction(parent.direction())
    , m_visibility(parent.visibility())
    , m_overflow(element->isRootElement() ? Overflow::Visible : Overflow::Hidden)
    , m_marker_start(parent.marker_start())
    , m_marker_mid(parent.marker_mid())
    , m_marker_end(parent.marker_end())
    , m_font_family(parent.font_family())
{
    for(const auto& attribute : element->attributes()) {
        std::string_view input(attribute.value());
        stripLeadingAndTrailingSpaces(input);
        if(input.empty() || input.compare("inherit") == 0)
            continue;
        switch(attribute.id()) {
        case PropertyID::Fill:
            m_fill = parsePaint(input, this, Color::Black);
            break;
        case PropertyID::Stroke:
            m_stroke = parsePaint(input, this, Color::Transparent);
            break;
        case PropertyID::Color:
            m_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Stop_Color:
            m_stop_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Opacity:
            m_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Fill_Opacity:
            m_fill_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Opacity:
            m_stroke_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stop_Opacity:
            m_stop_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Miterlimit:
            m_stroke_miterlimit = parseNumberOrPercentage(input, false, 4.f);
            break;
        case PropertyID::Font_Size:
            m_font_size = parseFontSize(input, this);
            break;
        case PropertyID::Baseline_Shift:
            m_baseline_shit = parseBaselineShift(input);
            break;
        case PropertyID::Stroke_Width:
            m_stroke_width = parseLength(input, LengthNegativeMode::Forbid, Length(1.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dashoffset:
            m_stroke_dashoffset = parseLength(input, LengthNegativeMode::Allow, Length(0.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dasharray:
            m_stroke_dasharray = parseDashArray(input);
            break;
        case PropertyID::Stroke_Linecap:
            m_stroke_linecap = parseLineCap(input);
            break;
        case PropertyID::Stroke_Linejoin:
            m_stroke_linejoin = parseLineJoin(input);
            break;
        case PropertyID::Fill_Rule:
            m_fill_rule = parseFillRule(input);
            break;
        case PropertyID::Clip_Rule:
            m_clip_rule = parseFillRule(input);
            break;
        case PropertyID::Font_Weight:
            m_font_weight = parseFontWeight(input);
            break;
        case PropertyID::Font_Style:
            m_font_style = parseFontStyle(input);
            break;
        case PropertyID::Alignment_Baseline:
            m_alignment_baseline = parseAlignmentBaseline(input);
            break;
        case PropertyID::Dominant_Baseline:
            m_dominant_baseline = parseDominantBaseline(input);
            break;
        case PropertyID::Direction:
            m_direction = parseDirection(input);
            break;
        case PropertyID::Text_Anchor:
            m_text_anchor = parseTextAnchor(input);
            break;
        case PropertyID::WhiteSpace:
            m_white_space = parseWhiteSpace(input);
            break;
        case PropertyID::Display:
            m_display = parseDisplay(input);
            break;
        case PropertyID::Visibility:
            m_visibility = parseVisibility(input);
            break;
        case PropertyID::Overflow:
            m_overflow = parseOverflow(input);
            break;
        case PropertyID::Mask_Type:
            m_mask_type = parseMaskType(input);
            break;
        case PropertyID::Mask:
            m_mask = parseUrl(input);
            break;
        case PropertyID::Clip_Path:
            m_clip_path = parseUrl(input);
            break;
        case PropertyID::Marker_Start:
            m_marker_start = parseUrl(input);
            break;
        case PropertyID::Marker_Mid:
            m_marker_mid = parseUrl(input);
            break;
        case PropertyID::Marker_End:
            m_marker_end = parseUrl(input);
            break;
        case PropertyID::Font_Family:
            m_font_family.assign(input);
            break;
        default:
            break;
        }
    }
}